

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O3

MovePtr<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
* __thiscall
vkt::sr::anon_unknown_0::makePixelOffsetsFunctor
          (MovePtr<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
           *__return_storage_ptr__,anon_unknown_0 *this,GatherType gatherType,GatherArgs *gatherArgs
          ,IVec2 *offsetRange)

{
  PixelOffsets *pPVar1;
  MovePtr<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
  *pMVar2;
  undefined4 in_register_00000014;
  long lVar3;
  uint uVar4;
  uint uVar5;
  
  uVar4 = (uint)this;
  lVar3 = CONCAT44(in_register_00000014,gatherType);
  if (uVar4 < 2) {
    uVar5 = uVar4;
    if (uVar4 != 0) {
      uVar4 = *(uint *)(lVar3 + 8);
      uVar5 = *(uint *)(lVar3 + 4);
    }
    pMVar2 = (MovePtr<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
              *)operator_new(0x28);
    *(uint *)&(pMVar2->
              super_UniqueBase<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
              ).m_data.field_0x8 = uVar5;
    *(uint *)&(pMVar2->
              super_UniqueBase<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
              ).m_data.field_0xc = uVar4 + 1;
    *(uint *)&pMVar2[1].
              super_UniqueBase<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
              .m_data.ptr = uVar5 + 1;
    *(uint *)((long)&pMVar2[1].
                     super_UniqueBase<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
                     .m_data.ptr + 4) = uVar4 + 1;
    *(uint *)&pMVar2[1].
              super_UniqueBase<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
              .m_data.field_0x8 = uVar5 + 1;
    *(uint *)&pMVar2[1].
              super_UniqueBase<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
              .m_data.field_0xc = uVar4;
    *(uint *)&pMVar2[2].
              super_UniqueBase<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
              .m_data.ptr = uVar5;
    *(uint *)((long)&pMVar2[2].
                     super_UniqueBase<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
                     .m_data.ptr + 4) = uVar4;
    (pMVar2->
    super_UniqueBase<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
    ).m_data.ptr = (PixelOffsets *)&PTR_operator___00d2d840;
  }
  else if (uVar4 == 3) {
    pMVar2 = (MovePtr<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
              *)operator_new(0x28);
    (pMVar2->
    super_UniqueBase<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
    ).m_data.ptr = (PixelOffsets *)&PTR_operator___00d2d8a8;
    pPVar1 = *(PixelOffsets **)(lVar3 + 0xc);
    *(undefined8 *)
     &(pMVar2->
      super_UniqueBase<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
      ).m_data.field_0x8 = *(undefined8 *)(lVar3 + 4);
    pMVar2[1].
    super_UniqueBase<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
    .m_data.ptr = pPVar1;
    pPVar1 = *(PixelOffsets **)(lVar3 + 0x1c);
    *(undefined8 *)
     &pMVar2[1].
      super_UniqueBase<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
      .m_data.field_0x8 = *(undefined8 *)(lVar3 + 0x14);
    pMVar2[2].
    super_UniqueBase<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
    .m_data.ptr = pPVar1;
  }
  else if (uVar4 == 2) {
    pMVar2 = (MovePtr<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
              *)operator_new(0x10);
    (pMVar2->
    super_UniqueBase<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
    ).m_data.ptr = (PixelOffsets *)&PTR_operator___00d2d8d0;
    *(int *)&(pMVar2->
             super_UniqueBase<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
             ).m_data.field_0x8 = (int)gatherArgs;
    *(int *)&(pMVar2->
             super_UniqueBase<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
             ).m_data.field_0xc = (int)offsetRange;
  }
  else {
    pMVar2 = (MovePtr<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
              *)0x0;
  }
  (__return_storage_ptr__->
  super_UniqueBase<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
  ).m_data.ptr = (PixelOffsets *)pMVar2;
  return pMVar2;
}

Assistant:

static MovePtr<PixelOffsets> makePixelOffsetsFunctor (GatherType gatherType, const GatherArgs& gatherArgs, const IVec2& offsetRange)
{
	if (gatherType == GATHERTYPE_BASIC || gatherType == GATHERTYPE_OFFSET)
	{
		const IVec2 offset = gatherType == GATHERTYPE_BASIC ? IVec2(0) : gatherArgs.offsets[0];
		return MovePtr<PixelOffsets>(new SinglePixelOffsets(offset));
	}
	else if (gatherType == GATHERTYPE_OFFSET_DYNAMIC)
	{
		return MovePtr<PixelOffsets>(new DynamicSinglePixelOffsets(offsetRange));
	}
	else if (gatherType == GATHERTYPE_OFFSETS)
		return MovePtr<PixelOffsets>(new MultiplePixelOffsets(gatherArgs.offsets[0],
															  gatherArgs.offsets[1],
															  gatherArgs.offsets[2],
															  gatherArgs.offsets[3]));
	else
	{
		DE_ASSERT(false);
		return MovePtr<PixelOffsets>(DE_NULL);
	}
}